

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O3

int mg_session_send_hello_message(mg_session *session,mg_map *extra)

{
  int iVar1;
  char local_12;
  char local_11;
  
  iVar1 = mg_session_write_raw(session,&local_12,1);
  if (iVar1 == 0) {
    iVar1 = mg_session_write_raw(session,&local_11,1);
    if (iVar1 == 0) {
      iVar1 = mg_session_write_map(session,extra);
      if (iVar1 == 0) {
        iVar1 = mg_session_flush_message(session);
      }
    }
  }
  return iVar1;
}

Assistant:

int mg_session_send_hello_message(mg_session *session, const mg_map *extra) {
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT + 1)));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_MESSAGE_HELLO));
  MG_RETURN_IF_FAILED(mg_session_write_map(session, extra));
  return mg_session_flush_message(session);
}